

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

void google::protobuf::internal::VerifyVersion(int protobufVersionCompiledWith,char *filename)

{
  LogMessage *pLVar1;
  int version;
  int version_00;
  string_view str;
  string_view str_00;
  string_view str_01;
  LogMessage LStack_68;
  char *local_58;
  string local_50;
  string local_30;
  
  if (protobufVersionCompiledWith == 0x5c0698) {
    return;
  }
  local_58 = filename;
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_68,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/stubs/common.cc"
             ,0x30);
  str._M_str = "This program was compiled with Protobuf C++ version ";
  str._M_len = 0x34;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_68,str);
  VersionString_abi_cxx11_(&local_30,(internal *)(ulong)(uint)protobufVersionCompiledWith,version);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_68,&local_30);
  str_00._M_str = ", but the linked version is ";
  str_00._M_len = 0x1c;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar1,str_00);
  VersionString_abi_cxx11_(&local_50,(internal *)0x5c0698,version_00);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,&local_50);
  str_01._M_str =
       ".  Please update your library.  If you compiled the program yourself, make sure thatyour headers are from the same version of Protocol Buffers as your link-time library.  (Version verification failed in \""
  ;
  str_01._M_len = 0xcc;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar1,str_01);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<<const_char_*,_0>
                     (pLVar1,&local_58);
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,(char (*) [4])0x3d76ab);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_68)
  ;
}

Assistant:

void VerifyVersion(int protobufVersionCompiledWith, const char* filename) {
  // If the user's program is linked against a different version of Protobuf,
  // GOOGLE_PROTOBUF_VERSION will have a different value.
  if (GOOGLE_PROTOBUF_VERSION != protobufVersionCompiledWith) {
    ABSL_LOG(FATAL)
        << "This program was compiled with Protobuf C++ version "
        << VersionString(protobufVersionCompiledWith)
        << ", but the linked version is "
        << VersionString(GOOGLE_PROTOBUF_VERSION)
        << ".  Please update your library.  If you compiled the program "
           "yourself, make sure that"
           "your headers are from the same version of Protocol Buffers as your "
           "link-time library.  (Version verification failed in \""
        << filename << "\".)";
  }
}